

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
google::
dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::dense_hashtable(dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *this,dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *ht,size_type min_buckets_wanted)

{
  undefined8 uVar1;
  size_type sVar2;
  int *piVar3;
  float fVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  size_type sVar13;
  
  iVar10 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
           id_;
  iVar11 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
           num_hashes_;
  uVar1 = *(undefined8 *)
           &(ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
            num_compares_;
  sVar13 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
           enlarge_threshold_;
  sVar2 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
          shrink_threshold_;
  fVar4 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_;
  bVar5 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_
  ;
  bVar6 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_empty_;
  bVar7 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_;
  uVar8 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.field_0x2b;
  uVar9 = (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.num_ht_copies_;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_factor_ =
       (ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_factor_;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_ = fVar4
  ;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
       bVar5;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_empty_ = bVar6;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_ = bVar7;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.field_0x2b = uVar8;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.num_ht_copies_ = uVar9
  ;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_threshold_ =
       sVar13;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_ =
       sVar2;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.id_ =
       iVar10;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = iVar11;
  *(undefined8 *)
   &(this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
    num_compares_ = uVar1;
  iVar10 = (ht->key_info).super_Hasher.num_hashes_;
  uVar1 = *(undefined8 *)&(ht->key_info).super_Hasher.num_compares_;
  (this->key_info).super_Hasher.id_ = (ht->key_info).super_Hasher.id_;
  (this->key_info).super_Hasher.num_hashes_ = iVar10;
  *(undefined8 *)&(this->key_info).super_Hasher.num_compares_ = uVar1;
  (this->key_info).empty_key = (ht->key_info).empty_key;
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = 0;
  uVar12 = *(undefined4 *)
            &(ht->val_info).
             super_alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
             .super_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>.
             field_0x4;
  piVar3 = (ht->val_info).
           super_alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
           .super_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>.count_;
  (this->val_info).
  super_alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>.
  super_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>.id_ =
       (ht->val_info).
       super_alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>.
       super_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>.id_;
  *(undefined4 *)
   &(this->val_info).
    super_alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>.
    super_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>.field_0x4 = uVar12
  ;
  (this->val_info).
  super_alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>.
  super_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>.count_ = piVar3;
  this->table = (pointer)0x0;
  if ((ht->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_empty_ != false)
  {
    sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::reset_thresholds
              ((sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *)this,0);
    dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::
    copy_or_move_from<google::dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>const&>
              ((dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)this,ht,min_buckets_wanted);
    return;
  }
  sVar13 = sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::min_buckets
                     ((sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *)this,
                      ht->num_elements - ht->num_deleted,min_buckets_wanted);
  this->num_buckets = sVar13;
  sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *)this,sVar13);
  return;
}

Assistant:

dense_hashtable(const dense_hashtable& ht,
                  size_type min_buckets_wanted = HT_DEFAULT_STARTING_BUCKETS)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        num_elements(0),
        num_buckets(0),
        val_info(ht.val_info),
        table(NULL) {
    if (!ht.settings.use_empty()) {
      // If use_empty isn't set, copy_from will crash, so we do our own copying.
      assert(ht.empty());
      num_buckets = settings.min_buckets(ht.size(), min_buckets_wanted);
      settings.reset_thresholds(bucket_count());
      return;
    }
    settings.reset_thresholds(bucket_count());
    copy_or_move_from(ht, min_buckets_wanted);  // copy_or_move_from() ignores deleted entries
  }